

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O1

bool __thiscall
lzham::lzcompressor::state::advance
          (state *this,CLZBase *lzbase,search_accelerator *dict,lzdecision *lzdec)

{
  undefined8 uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  bool bVar9;
  uint uVar10;
  undefined1 *puVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar12 = (this->super_state_base).m_cur_state;
  uVar2 = this->m_is_match_model[uVar12].m_bit_0_prob;
  if (lzdec->m_len < 1) {
    sVar5 = (short)(0x800 - uVar2 >> 5);
  }
  else {
    sVar5 = -(uVar2 >> 5);
  }
  this->m_is_match_model[uVar12].m_bit_0_prob = uVar2 + sVar5;
  iVar4 = (int)this;
  if (lzdec->m_len < 1) {
    if (uVar12 < 7) {
      uVar12 = iVar4 + 0xb8;
    }
    else {
      uVar12 = iVar4 + 0x148;
    }
    cVar8 = lzham::quasi_adaptive_huffman_data_model::update_sym(uVar12);
    if (cVar8 == '\0') goto LAB_0010c2d5;
    uVar12 = (this->super_state_base).m_cur_state;
    uVar10 = 0;
    if (3 < uVar12) {
      if (uVar12 < 10) {
        uVar10 = uVar12 - 3;
      }
      else {
        uVar10 = uVar12 - 6;
      }
    }
LAB_0010c30a:
    (this->super_state_base).m_cur_state = uVar10;
    (this->super_state_base).m_cur_ofs = lzdec->m_len + lzdec->m_pos + (uint)(lzdec->m_len == 0);
    bVar9 = true;
  }
  else {
    uVar2 = this->m_is_rep_model[uVar12].m_bit_0_prob;
    if (lzdec->m_dist < 0) {
      this->m_is_rep_model[uVar12].m_bit_0_prob = uVar2 - (uVar2 >> 5);
      iVar3 = lzdec->m_dist;
      uVar2 = this->m_is_rep0_model[uVar12].m_bit_0_prob;
      if (iVar3 == -1) {
        this->m_is_rep0_model[uVar12].m_bit_0_prob = uVar2 - (uVar2 >> 5);
        uVar2 = this->m_is_rep0_single_byte_model[uVar12].m_bit_0_prob;
        if (lzdec->m_len == 1) {
          this->m_is_rep0_single_byte_model[uVar12].m_bit_0_prob = uVar2 - (uVar2 >> 5);
          uVar10 = (uint)(6 < uVar12) * 2 + 9;
          goto LAB_0010c30a;
        }
        this->m_is_rep0_single_byte_model[uVar12].m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2
        ;
        cVar8 = lzham::quasi_adaptive_huffman_data_model::update_sym
                          (iVar4 + (uint)(6 < uVar12) * 0x90 + 0x268);
        if (cVar8 != '\0') goto LAB_0010c2fa;
      }
      else {
        this->m_is_rep0_model[uVar12].m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
        cVar8 = lzham::quasi_adaptive_huffman_data_model::update_sym
                          (iVar4 + (uint)(6 < uVar12) * 0x90 + 0x268);
        if (cVar8 != '\0') {
          uVar12 = (this->super_state_base).m_cur_state;
          uVar2 = this->m_is_rep1_model[uVar12].m_bit_0_prob;
          if (iVar3 == -2) {
            this->m_is_rep1_model[uVar12].m_bit_0_prob = uVar2 - (uVar2 >> 5);
            uVar1 = *(undefined8 *)(this->super_state_base).m_match_hist;
            *(ulong *)(this->super_state_base).m_match_hist =
                 CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
          }
          else {
            this->m_is_rep1_model[uVar12].m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar2 = this->m_is_rep2_model[uVar12].m_bit_0_prob;
            if (iVar3 == -3) {
              this->m_is_rep2_model[uVar12].m_bit_0_prob = uVar2 - (uVar2 >> 5);
              uVar10 = (this->super_state_base).m_match_hist[2];
              *(undefined8 *)((this->super_state_base).m_match_hist + 1) =
                   *(undefined8 *)(this->super_state_base).m_match_hist;
              (this->super_state_base).m_match_hist[0] = uVar10;
            }
            else {
              this->m_is_rep2_model[uVar12].m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar10 = (this->super_state_base).m_match_hist[0];
              uVar6 = (this->super_state_base).m_match_hist[1];
              uVar7 = (this->super_state_base).m_match_hist[2];
              (this->super_state_base).m_match_hist[0] = (this->super_state_base).m_match_hist[3];
              (this->super_state_base).m_match_hist[1] = uVar10;
              (this->super_state_base).m_match_hist[2] = uVar6;
              (this->super_state_base).m_match_hist[3] = uVar7;
            }
          }
LAB_0010c2fa:
          uVar10 = (uint)(6 < (this->super_state_base).m_cur_state) * 3 + 8;
          goto LAB_0010c30a;
        }
      }
    }
    else {
      this->m_is_rep_model[uVar12].m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
      uVar12 = lzdec->m_dist;
      if ((ulong)uVar12 < 0x1000) {
        uVar13 = (ulong)(byte)CLZBase::m_slot_tab0[uVar12];
      }
      else {
        if (uVar12 < 0x100000) {
          uVar12 = uVar12 >> 0xb;
          puVar11 = CLZBase::m_slot_tab1;
        }
        else {
          if (0xffffff < uVar12) {
            if (uVar12 < 0x2000000) {
              uVar13 = (ulong)((uVar12 - 0x1000000 >> 0x17) + 0x30);
            }
            else if (uVar12 < 0x4000000) {
              uVar13 = (ulong)((uVar12 + 0xfe000000 >> 0x18) + 0x32);
            }
            else {
              uVar13 = (ulong)((uVar12 + 0xfc000000 >> 0x19) + 0x34);
            }
            goto LAB_0010c06d;
          }
          uVar12 = uVar12 >> 0x10;
          puVar11 = CLZBase::m_slot_tab2;
        }
        uVar13 = (ulong)(byte)puVar11[uVar12];
      }
LAB_0010c06d:
      iVar3 = lzdec->m_len + -9;
      if (lzdec->m_len < 9) {
        iVar3 = -1;
      }
      cVar8 = lzham::quasi_adaptive_huffman_data_model::update_sym(iVar4 + 0x1d8);
      if (((cVar8 != '\0') &&
          ((iVar3 < 0 ||
           (cVar8 = lzham::quasi_adaptive_huffman_data_model::update_sym
                              (iVar4 + 0x388 +
                               (uint)(6 < (this->super_state_base).m_cur_state) * 0x90),
           cVar8 != '\0')))) &&
         ((*(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + uVar13) < 3 ||
          (cVar8 = lzham::quasi_adaptive_huffman_data_model::update_sym(iVar4 + 0x4a8),
          cVar8 != '\0')))) {
        uVar10 = lzdec->m_dist;
        (this->super_state_base).m_match_hist[3] = (this->super_state_base).m_match_hist[2];
        *(undefined8 *)((this->super_state_base).m_match_hist + 1) =
             *(undefined8 *)(this->super_state_base).m_match_hist;
        (this->super_state_base).m_match_hist[0] = uVar10;
        uVar10 = (uint)(6 < (this->super_state_base).m_cur_state) * 3 + 7;
        goto LAB_0010c30a;
      }
    }
LAB_0010c2d5:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool lzcompressor::state::advance(CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec)
   {
      //const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(m_cur_state);
      m_is_match_model[is_match_model_index].update(lzdec.is_match());

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            // literal
            if (!m_lit_table.update_sym(lit)) 
            {
               LZHAM_LOG_ERROR(8008);
               return false;
            }
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            
            uint delta_lit = rep_lit0 ^ lit;
				            
            if (!m_delta_lit_table.update_sym(delta_lit)) 
            {
               LZHAM_LOG_ERROR(8009);
               return false;
            }
         }

         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            m_is_rep_model[m_cur_state].update(1);

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               m_is_rep0_model[m_cur_state].update(1);

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  m_is_rep0_single_byte_model[m_cur_state].update(1);

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  // normal rep0
                  m_is_rep0_single_byte_model[m_cur_state].update(0);

                  if (lzdec.m_len > CLZBase::cMaxMatchLen)
                  {
                     if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen)) 
                     {
                        LZHAM_LOG_ERROR(8010);
                        return false;
                     }
                  }
                  else
                  {
                     if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym(lzdec.m_len - CLZBase::cMinMatchLen)) 
                     {
                        LZHAM_LOG_ERROR(8011);
                        return false;
                     }
                  }

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               // rep1-rep3 match
               m_is_rep0_model[m_cur_state].update(0);

               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen)) 
                  {
                     LZHAM_LOG_ERROR(8012);
                     return false;
                  }
               }
               else
               {
                  if (!m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym(lzdec.m_len - CLZBase::cMinMatchLen)) 
                  {
                     LZHAM_LOG_ERROR(8013);
                     return false;
                  }
               }

               if (match_hist_index == 1)
               {
                  // rep1
                  m_is_rep1_model[m_cur_state].update(1);

                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else
               {
                  m_is_rep1_model[m_cur_state].update(0);

                  if (match_hist_index == 2)
                  {
                     // rep2
                     m_is_rep2_model[m_cur_state].update(1);

                     int dist = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
                  else
                  {
                     // rep3
                     m_is_rep2_model[m_cur_state].update(0);

                     int dist = m_match_hist[3];
                     m_match_hist[3] = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            m_is_rep_model[m_cur_state].update(0);

            LZHAM_ASSERT(lzdec.m_len >= CLZBase::cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            int large_len_sym = -1;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;

               large_len_sym = lzdec.m_len - 9;
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            if (!m_main_table.update_sym(CLZBase::cLZXNumSpecialLengths + main_sym)) 
            {
               LZHAM_LOG_ERROR(8014);
               return false;
            }

            if (large_len_sym >= 0)
            {
               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym((CLZBase::cMaxMatchLen + 1) - 9)) 
                  {
                     LZHAM_LOG_ERROR(8015);
                     return false;
                  }
               }
               else
               {
                  if (!m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].update_sym(large_len_sym)) 
                  {
                     LZHAM_LOG_ERROR(8016);
                     return false;
                  }
               }
            }

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits >= 3)
            {
               if (!m_dist_lsb_table.update_sym(match_extra & 15)) 
               {
                  LZHAM_LOG_ERROR(8017);
                  return false;
               }
            }

            update_match_hist(lzdec.m_dist);

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
      return true;
   }